

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizerParameters.cpp
# Opt level: O3

void __thiscall OpenMD::MinimizerParameters::validate(MinimizerParameters *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 *puVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  int iVar6;
  int iVar7;
  pointer pcVar8;
  bool bVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  EqualIgnoreCaseConstraint local_3c8;
  double local_388;
  double dStack_380;
  OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint> local_378;
  EqualIgnoreCaseConstraint local_2d8;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_298;
  double local_198;
  double dStack_190;
  EqualIgnoreCaseConstraint local_188;
  string local_148;
  string local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  long *local_68 [2];
  long local_58 [2];
  double local_48;
  double dStack_40;
  
  if ((this->Method).super_ParameterBase.empty_ == false) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"SD","");
    isEqualIgnoreCase(&local_3c8,&local_88);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"CG","");
    isEqualIgnoreCase(&local_2d8,&local_a8);
    OpenMD::operator||(&local_378,
                       &local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>,
                       &local_2d8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"BFGS","");
    isEqualIgnoreCase(&local_188,&local_c8);
    OpenMD::operator||(&local_298,
                       &local_378.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_188.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    pcVar8 = (this->Method).data_._M_dataplus._M_p;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar8,pcVar8 + (this->Method).data_._M_string_length);
    bVar10 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
             ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
                           *)&local_298,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.rhs_._M_dataplus._M_p != &local_188.rhs_.field_2) {
      operator_delete(local_188.rhs_._M_dataplus._M_p,
                      local_188.rhs_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           _M_dataplus._M_p !=
        &local_188.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
         field_2) {
      operator_delete(local_188.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_._M_dataplus._M_p,
                      local_188.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378.cons2_.rhs_._M_dataplus._M_p != &local_378.cons2_.rhs_.field_2) {
      operator_delete(local_378.cons2_.rhs_._M_dataplus._M_p,
                      local_378.cons2_.rhs_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_._M_dataplus._M_p !=
        &local_378.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
         description_.field_2) {
      operator_delete(local_378.cons2_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      _M_dataplus._M_p,
                      local_378.cons2_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378.cons1_.rhs_._M_dataplus._M_p != &local_378.cons1_.rhs_.field_2) {
      operator_delete(local_378.cons1_.rhs_._M_dataplus._M_p,
                      local_378.cons1_.rhs_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_._M_dataplus._M_p !=
        &local_378.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
         description_.field_2) {
      operator_delete(local_378.cons1_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      _M_dataplus._M_p,
                      local_378.cons1_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p !=
        &local_378.
         super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
         .description_.field_2) {
      operator_delete(local_378.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_378.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.rhs_._M_dataplus._M_p != &local_2d8.rhs_.field_2) {
      operator_delete(local_2d8.rhs_._M_dataplus._M_p,
                      local_2d8.rhs_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           _M_dataplus._M_p !=
        &local_2d8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
         field_2) {
      operator_delete(local_2d8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_._M_dataplus._M_p,
                      local_2d8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8.rhs_._M_dataplus._M_p != &local_3c8.rhs_.field_2) {
      operator_delete(local_3c8.rhs_._M_dataplus._M_p,
                      local_3c8.rhs_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           _M_dataplus._M_p !=
        &local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
         field_2) {
      operator_delete(local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_._M_dataplus._M_p,
                      local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (!bVar10) {
      pcVar8 = (this->Method).super_ParameterBase.keyword_._M_dataplus._M_p;
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"SD","");
      isEqualIgnoreCase(&local_3c8,&local_108);
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"CG","");
      isEqualIgnoreCase(&local_2d8,&local_128);
      OpenMD::operator||(&local_378,
                         &local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>,
                         &local_2d8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"BFGS","");
      isEqualIgnoreCase(&local_188,&local_148);
      OpenMD::operator||(&local_298,
                         &local_378.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_188.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>)
      ;
      local_68[0] = local_58;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_68,
                 local_298.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p,
                 local_298.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p +
                 local_298.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_string_length);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar8,local_68[0]);
      if (local_68[0] != local_58) {
        operator_delete(local_68[0],local_58[0] + 1);
      }
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188.rhs_._M_dataplus._M_p != &local_188.rhs_.field_2) {
        operator_delete(local_188.rhs_._M_dataplus._M_p,
                        local_188.rhs_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p !=
          &local_188.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           field_2) {
        operator_delete(local_188.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_188.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378.cons2_.rhs_._M_dataplus._M_p != &local_378.cons2_.rhs_.field_2) {
        operator_delete(local_378.cons2_.rhs_._M_dataplus._M_p,
                        local_378.cons2_.rhs_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
             description_._M_dataplus._M_p !=
          &local_378.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_.field_2) {
        operator_delete(local_378.cons2_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        _M_dataplus._M_p,
                        local_378.cons2_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378.cons1_.rhs_._M_dataplus._M_p != &local_378.cons1_.rhs_.field_2) {
        operator_delete(local_378.cons1_.rhs_._M_dataplus._M_p,
                        local_378.cons1_.rhs_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
             description_._M_dataplus._M_p !=
          &local_378.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_.field_2) {
        operator_delete(local_378.cons1_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        _M_dataplus._M_p,
                        local_378.cons1_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_378.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_378.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_378.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8.rhs_._M_dataplus._M_p != &local_2d8.rhs_.field_2) {
        operator_delete(local_2d8.rhs_._M_dataplus._M_p,
                        local_2d8.rhs_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p !=
          &local_2d8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           field_2) {
        operator_delete(local_2d8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_2d8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8.rhs_._M_dataplus._M_p != &local_3c8.rhs_.field_2) {
        operator_delete(local_3c8.rhs_._M_dataplus._M_p,
                        local_3c8.rhs_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p !=
          &local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           field_2) {
        operator_delete(local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->MaxIterations).super_ParameterBase.empty_ == false) {
    isPositive();
    iVar6 = *(int *)&(this->MaxIterations).super_ParameterBase.field_0x2c;
    paVar2 = &local_298.
              super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
              .description_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p != paVar2) {
      operator_delete(local_298.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_298.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if (iVar6 < 1) {
      pcVar8 = (this->MaxIterations).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      local_298.
      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
      .description_._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,
                 local_378.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p,
                 local_378.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p +
                 local_378.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_string_length);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar8,
               local_298.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p != paVar2) {
        operator_delete(local_298.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_298.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_378.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_378.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_378.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->MaxStationaryStateIterations).super_ParameterBase.empty_ == false) {
    iVar6 = *(int *)&(this->MaxIterations).super_ParameterBase.field_0x2c;
    GreaterThanOrEqualTo<int>::GreaterThanOrEqualTo((GreaterThanOrEqualTo<int> *)&local_378,1);
    LessThanOrEqualToConstraint<int>::LessThanOrEqualToConstraint
              ((LessThanOrEqualToConstraint<int> *)&local_3c8,iVar6);
    operator&&((AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>
                *)&local_298,(ParamConstraintFacade<OpenMD::GreaterThanOrEqualTo<int>_> *)&local_378
               ,(ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<int>_> *)&local_3c8);
    iVar7 = *(int *)&(this->MaxStationaryStateIterations).super_ParameterBase.field_0x2c;
    puVar3 = (undefined1 *)
             ((long)&local_298.cons1_.cons1_.
                     super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                     field_2 + 8);
    bVar9 = iVar7 < (int)local_298.cons1_.cons1_.
                         super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_
                         ._M_dataplus._M_p;
    bVar10 = (int)local_298.cons1_.cons1_.rhs_._M_string_length < iVar7;
    if ((undefined1 *)
        local_298.cons1_.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
        description_._M_string_length != puVar3) {
      operator_delete((void *)local_298.cons1_.cons1_.
                              super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                              description_._M_string_length,
                      local_298.cons1_.cons1_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      field_2._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.cons1_.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p !=
        &local_298.cons1_.
         super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
         .description_.field_2) {
      operator_delete(local_298.cons1_.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_298.cons1_.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_298.
              super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
              .description_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p != paVar2) {
      operator_delete(local_298.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_298.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           _M_dataplus._M_p !=
        &local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
         field_2) {
      operator_delete(local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_._M_dataplus._M_p,
                      local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_.field_2._M_allocated_capacity + 1);
    }
    paVar1 = &local_378.
              super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
              .description_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p != paVar1) {
      operator_delete(local_378.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_378.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if (bVar9 || bVar10) {
      pcVar8 = (this->MaxStationaryStateIterations).super_ParameterBase.keyword_._M_dataplus._M_p;
      GreaterThanOrEqualTo<int>::GreaterThanOrEqualTo((GreaterThanOrEqualTo<int> *)&local_378,1);
      LessThanOrEqualToConstraint<int>::LessThanOrEqualToConstraint
                ((LessThanOrEqualToConstraint<int> *)&local_3c8,iVar6);
      operator&&((AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>
                  *)&local_298,
                 (ParamConstraintFacade<OpenMD::GreaterThanOrEqualTo<int>_> *)&local_378,
                 (ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<int>_> *)&local_3c8);
      paVar4 = &local_2d8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                description_.field_2;
      local_2d8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
      _M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d8,
                 local_298.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p,
                 local_298.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p +
                 local_298.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_string_length);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar8,
               local_2d8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_
               ._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p != paVar4) {
        operator_delete(local_2d8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_2d8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)
          local_298.cons1_.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
          description_._M_string_length != puVar3) {
        operator_delete((void *)local_298.cons1_.cons1_.
                                super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                                description_._M_string_length,
                        local_298.cons1_.cons1_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        field_2._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.cons1_.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_298.cons1_.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_298.cons1_.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_298.cons1_.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p != paVar2) {
        operator_delete(local_298.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_298.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p !=
          &local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           field_2) {
        operator_delete(local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p != paVar1) {
        operator_delete(local_378.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_378.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->RootEpsilon).super_ParameterBase.empty_ == false) {
    isPositive();
    dVar13 = (this->RootEpsilon).data_;
    paVar2 = &local_298.
              super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
              .description_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p != paVar2) {
      local_388 = dVar13;
      operator_delete(local_298.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_298.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
      dVar13 = local_388;
    }
    if (dVar13 <= 0.0) {
      pcVar8 = (this->RootEpsilon).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      local_298.
      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
      .description_._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,
                 local_378.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p,
                 local_378.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p +
                 local_378.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_string_length);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar8,
               local_298.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p != paVar2) {
        operator_delete(local_298.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_298.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_378.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_378.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_378.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->GradientNormEpsilon).super_ParameterBase.empty_ == false) {
    isPositive();
    dVar13 = (this->GradientNormEpsilon).data_;
    paVar2 = &local_298.
              super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
              .description_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p != paVar2) {
      local_388 = dVar13;
      operator_delete(local_298.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_298.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
      dVar13 = local_388;
    }
    if (dVar13 <= 0.0) {
      pcVar8 = (this->GradientNormEpsilon).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      local_298.
      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
      .description_._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,
                 local_378.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p,
                 local_378.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p +
                 local_378.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_string_length);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar8,
               local_298.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p != paVar2) {
        operator_delete(local_298.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_298.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_378.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_378.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_378.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->InitialStepSize).super_ParameterBase.empty_ == false) {
    GreaterThanConstraint<double>::GreaterThanConstraint
              ((GreaterThanConstraint<double> *)&local_378,0.0);
    LessThanOrEqualToConstraint<double>::LessThanOrEqualToConstraint
              ((LessThanOrEqualToConstraint<double> *)&local_3c8,1.0);
    operator&&((AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
                *)&local_298,
               (ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_> *)&local_378,
               (ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_> *)&local_3c8);
    dVar13 = (this->InitialStepSize).data_;
    puVar3 = (undefined1 *)
             ((long)&local_298.cons1_.cons1_.
                     super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                     field_2 + 8);
    local_48 = (double)CONCAT44(local_298.cons1_.cons1_.rhs_._M_string_length._4_4_,
                                (int)local_298.cons1_.cons1_.rhs_._M_string_length);
    dVar11 = (double)CONCAT44(local_298.cons1_.cons1_.
                              super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                              description_._M_dataplus._M_p._4_4_,
                              (int)local_298.cons1_.cons1_.
                                   super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                                   description_._M_dataplus._M_p);
    dVar14 = 0.0;
    dVar17 = 0.0;
    dVar19 = 0.0;
    if ((undefined1 *)
        local_298.cons1_.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
        description_._M_string_length != puVar3) {
      dStack_380 = 0.0;
      dStack_190 = 0.0;
      dStack_40 = 0.0;
      local_388 = (double)CONCAT44(local_298.cons1_.cons1_.
                                   super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                                   description_._M_dataplus._M_p._4_4_,
                                   (int)local_298.cons1_.cons1_.
                                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>
                                        .description_._M_dataplus._M_p);
      local_198 = dVar13;
      operator_delete((void *)local_298.cons1_.cons1_.
                              super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                              description_._M_string_length,
                      local_298.cons1_.cons1_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      field_2._8_8_ + 1);
      dVar11 = local_388;
      dVar14 = dStack_380;
      dVar13 = local_198;
      dVar17 = dStack_190;
      dVar19 = dStack_40;
    }
    paVar2 = &local_298.cons1_.
              super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
              .description_.field_2;
    dVar12 = (double)-(ulong)(dVar11 < dVar13);
    dVar15 = (double)-(ulong)(dVar14 < dVar17);
    dVar16 = (double)-(ulong)(dVar13 <= local_48);
    dVar18 = (double)-(ulong)(dVar17 <= dVar19);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.cons1_.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p != paVar2) {
      local_388 = (double)-(ulong)(dVar11 < dVar13);
      dStack_380 = (double)-(ulong)(dVar14 < dVar17);
      local_198 = (double)-(ulong)(dVar13 <= local_48);
      dStack_190 = (double)-(ulong)(dVar17 <= dVar19);
      operator_delete(local_298.cons1_.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_298.cons1_.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
      dVar12 = local_388;
      dVar15 = dStack_380;
      dVar16 = local_198;
      dVar18 = dStack_190;
    }
    paVar1 = &local_298.
              super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
              .description_.field_2;
    dVar13 = (double)((ulong)dVar12 & (ulong)dVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p != paVar1) {
      local_388 = (double)((ulong)dVar12 & (ulong)dVar16);
      dStack_380 = (double)((ulong)dVar15 & (ulong)dVar18);
      operator_delete(local_298.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_298.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
      dVar13 = local_388;
    }
    paVar4 = &local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
              field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           _M_dataplus._M_p != paVar4) {
      operator_delete(local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_._M_dataplus._M_p,
                      local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p !=
        &local_378.
         super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
         .description_.field_2) {
      operator_delete(local_378.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_378.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if (((ulong)dVar13 & 1) == 0) {
      pcVar8 = (this->InitialStepSize).super_ParameterBase.keyword_._M_dataplus._M_p;
      GreaterThanConstraint<double>::GreaterThanConstraint
                ((GreaterThanConstraint<double> *)&local_378,0.0);
      LessThanOrEqualToConstraint<double>::LessThanOrEqualToConstraint
                ((LessThanOrEqualToConstraint<double> *)&local_3c8,1.0);
      operator&&((AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
                  *)&local_298,
                 (ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_> *)&local_378,
                 (ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_> *)&local_3c8);
      paVar5 = &local_2d8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                description_.field_2;
      local_2d8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
      _M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d8,
                 local_298.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p,
                 local_298.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p +
                 local_298.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_string_length);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar8,
               local_2d8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_
               ._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p != paVar5) {
        operator_delete(local_2d8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_2d8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)
          local_298.cons1_.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
          description_._M_string_length != puVar3) {
        operator_delete((void *)local_298.cons1_.cons1_.
                                super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                                description_._M_string_length,
                        local_298.cons1_.cons1_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        field_2._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.cons1_.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p != paVar2) {
        operator_delete(local_298.cons1_.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_298.cons1_.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p != paVar1) {
        operator_delete(local_298.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_298.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p != paVar4) {
        operator_delete(local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_3c8.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_378.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_378.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_378.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void MinimizerParameters::validate() {
    CheckParameter(Method, isEqualIgnoreCase("SD") || isEqualIgnoreCase("CG") ||
                               isEqualIgnoreCase("BFGS"));
    CheckParameter(MaxIterations, isPositive());
    int one       = 1;
    int mi        = this->getMaxIterations();
    RealType zero = 0.0;
    RealType oneR = 1.0;
    CheckParameter(MaxStationaryStateIterations,
                   isGreaterThanOrEqualTo(one) && isLessThanOrEqualTo(mi));
    CheckParameter(RootEpsilon, isPositive());
    CheckParameter(GradientNormEpsilon, isPositive());
    CheckParameter(InitialStepSize,
                   isGreaterThan(zero) && isLessThanOrEqualTo(oneR));
  }